

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * __thiscall
soul::Value::tryCastToType
          (Value *__return_storage_ptr__,Value *this,Type *destType,CompileMessage *errorMessage)

{
  CompileMessage *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string sStack_b8;
  string local_98;
  CompileMessage local_78;
  string local_40;
  
  args_1 = errorMessage;
  tryCastToType(__return_storage_ptr__,this,destType);
  if ((__return_storage_ptr__->type).category == invalid) {
    if ((this->type).category == primitive) {
      getDescription_abi_cxx11_(&local_98,this,(StringDictionary *)0x0);
      Type::getDescription_abi_cxx11_(&sStack_b8,&this->type);
      Type::getDescription_abi_cxx11_(&local_40,destType);
      Errors::cannotCastValue<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (&local_78,(Errors *)&local_98,&sStack_b8,&local_40,in_R8);
      CompileMessage::operator=(errorMessage,&local_78);
      CompileMessage::~CompileMessage(&local_78);
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      Type::getDescription_abi_cxx11_(&local_98,&this->type);
      Type::getDescription_abi_cxx11_(&sStack_b8,destType);
      Errors::cannotCastBetween<std::__cxx11::string,std::__cxx11::string>
                (&local_78,(Errors *)&local_98,&sStack_b8,&args_1->description);
      CompileMessage::operator=(errorMessage,&local_78);
      CompileMessage::~CompileMessage(&local_78);
    }
    std::__cxx11::string::~string((string *)&sStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::tryCastToType (const Type& destType, CompileMessage& errorMessage) const
{
    auto result = tryCastToType (destType);

    if (! result.isValid())
    {
        if (type.isPrimitive())
            errorMessage = Errors::cannotCastValue (getDescription(), type.getDescription(), destType.getDescription());
        else
            errorMessage = Errors::cannotCastBetween (type.getDescription(), destType.getDescription());
    }

    return result;
}